

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O3

string * NetworkErrorString_abi_cxx11_(string *__return_storage_ptr__,int err)

{
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffec;
  
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SysErrorString_abi_cxx11_(in_stack_ffffffffffffffec);
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string NetworkErrorString(int err)
{
#if defined(WIN32)
    return Win32ErrorString(err);
#else
    // On BSD sockets implementations, NetworkErrorString is the same as SysErrorString.
    return SysErrorString(err);
#endif
}